

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O2

obj * hold_another_object(obj *obj,char *drop_fmt,char *drop_arg,char *hold_msg)

{
  char cVar1;
  short sVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  obj *obj_00;
  schar sVar6;
  char *__dest;
  int iVar7;
  obj *in_stack_fffffffffffffea8;
  char buf [256];
  
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001a7e27;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001a7e22;
LAB_001a7e4d:
    obj->field_0x4a = obj->field_0x4a | 0x20;
  }
  else {
LAB_001a7e22:
    if (ublindf != (obj *)0x0) {
LAB_001a7e27:
      if (ublindf->oartifact == '\x1d') goto LAB_001a7e4d;
    }
  }
  iVar7 = u.umonnum;
  iVar4 = u.umonster;
  if (obj->oartifact != '\0') {
    sVar2 = obj->otyp;
    uVar3 = *(uint *)&obj->field_0x4a;
    place_object(obj,level,(int)u.ux,(int)u.uy);
    iVar5 = touch_artifact(obj,&youmonst);
    if (iVar5 != 0) {
      if ((iVar7 == iVar4) || (u.umonnum != u.umonster)) {
        obj_extract_self(obj);
        if (sVar2 == 0x1a) {
          obj->otyp = 0x1a;
          *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xffffefff | uVar3 & 0x1000;
        }
        goto LAB_001a7f1e;
      }
      if (drop_fmt != (char *)0x0) {
        pline(drop_fmt,drop_arg);
      }
    }
    obj_extract_self(obj);
LAB_001a7f42:
    dropy(obj);
    return obj;
  }
LAB_001a7f1e:
  if (u.uprops[0x25].extrinsic != 0 || u.uprops[0x25].intrinsic != 0) {
    if (drop_fmt != (char *)0x0) {
      pline(drop_fmt,drop_arg);
    }
    goto LAB_001a7f42;
  }
  iVar4 = obj->quan;
  iVar5 = near_capacity();
  iVar7 = 2;
  if (2 < iVar5) {
    iVar7 = iVar5;
  }
  if (drop_arg == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    __dest = buf;
    strcpy(__dest,drop_arg);
  }
  obj_00 = addinv(in_stack_fffffffffffffea8);
  iVar5 = inv_cnt();
  if ((0x34 < iVar5) ||
     (((obj_00->otyp != 0x210 || ((obj_00->field_0x4a & 1) == 0)) &&
      (iVar5 = near_capacity(), iVar7 < iVar5)))) {
    if (drop_fmt != (char *)0x0) {
      pline(drop_fmt,__dest);
    }
    if (iVar4 < obj_00->quan) {
      obj_00 = splitobj(obj_00,(long)iVar4);
    }
    dropx(obj_00);
    return obj_00;
  }
  if (((flags.autoquiver == '\0') || (uquiver != (obj *)0x0)) || (obj_00->owornmask != 0))
  goto LAB_001a800f;
  cVar1 = obj_00->oclass;
  if ((cVar1 == '\x02') || (cVar1 == '\x06')) {
    sVar6 = objects[obj_00->otyp].oc_subtyp;
    if (2 < (byte)(sVar6 + 0x1bU)) {
      if (cVar1 != '\x02') goto LAB_001a800f;
      goto LAB_001a807f;
    }
  }
  else {
    if (cVar1 != '\r') goto LAB_001a800f;
    sVar6 = objects[obj_00->otyp].oc_subtyp;
LAB_001a807f:
    if ((((sVar6 < -0x18) || (uwep == (obj *)0x0 || -0x16 < sVar6)) ||
        ((int)objects[uwep->otyp].oc_subtyp + (int)sVar6 != 0)) &&
       (((cVar1 != '\r' && (cVar1 != '\x02')) ||
        ((sVar6 < -0x18 ||
         ((uswapwep == (obj *)0x0 || -0x16 < sVar6 ||
          ((int)sVar6 + (int)objects[uswapwep->otyp].oc_subtyp != 0)))))))) goto LAB_001a800f;
  }
  setuqwep(obj_00);
LAB_001a800f:
  if (drop_fmt == (char *)0x0 && hold_msg == (char *)0x0) {
    return obj_00;
  }
  prinv(hold_msg,obj_00,(long)iVar4);
  return obj_00;
}

Assistant:

struct obj *hold_another_object(struct obj *obj, const char *drop_fmt,
				const char *drop_arg, const char *hold_msg)
{
	char buf[BUFSZ];

	if (!Blind) obj->dknown = 1;	/* maximize mergibility */
	if (obj->oartifact) {
	    /* place_object may change these */
	    boolean crysknife = (obj->otyp == CRYSKNIFE);
	    int oerode = obj->oerodeproof;
	    boolean wasUpolyd = Upolyd;

	    /* in case touching this object turns out to be fatal */
	    place_object(obj, level, u.ux, u.uy);

	    if (!touch_artifact(obj, &youmonst)) {
		obj_extract_self(obj);	/* remove it from the floor */
		dropy(obj);		/* now put it back again :-) */
		return obj;
	    } else if (wasUpolyd && !Upolyd) {
		/* loose your grip if you revert your form */
		if (drop_fmt) pline(drop_fmt, drop_arg);
		obj_extract_self(obj);
		dropy(obj);
		return obj;
	    }
	    obj_extract_self(obj);
	    if (crysknife) {
		obj->otyp = CRYSKNIFE;
		obj->oerodeproof = oerode;
	    }
	}
	if (Fumbling) {
	    if (drop_fmt) pline(drop_fmt, drop_arg);
	    dropy(obj);
	} else {
	    long oquan = obj->quan;
	    int prev_encumbr = near_capacity();	/* before addinv() */

	    /* encumbrance only matters if it would now become worse
	       than max( current_value, stressed ) */
	    if (prev_encumbr < MOD_ENCUMBER) prev_encumbr = MOD_ENCUMBER;
	    /* addinv() may redraw the entire inventory, overwriting
	       drop_arg when it comes from something like doname() */
	    if (drop_arg) drop_arg = strcpy(buf, drop_arg);

	    obj = addinv(obj);
	    if (inv_cnt() > 52
		    || ((obj->otyp != LOADSTONE || !obj->cursed)
			&& near_capacity() > prev_encumbr)) {
		if (drop_fmt) pline(drop_fmt, drop_arg);
		/* undo any merge which took place */
		if (obj->quan > oquan) obj = splitobj(obj, oquan);
		dropx(obj);
	    } else {
		if (flags.autoquiver && !uquiver && !obj->owornmask &&
			(is_missile(obj) ||
			    ammo_and_launcher(obj, uwep) ||
			    ammo_and_launcher(obj, uswapwep)))
		    setuqwep(obj);
		if (hold_msg || drop_fmt) prinv(hold_msg, obj, oquan);
	    }
	}
	return obj;
}